

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerHLSL::emit_load(CompilerHLSL *this,Instruction *instruction)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  ExecutionModel EVar4;
  SPIRType *pSVar5;
  char **in_R8;
  bool local_18a;
  bool local_171;
  char *local_168;
  string local_160;
  string local_140;
  uint local_11c;
  uint local_118;
  uint32_t i;
  uint32_t num_elements;
  string load_expr_1;
  ID local_e8;
  ID local_e4;
  SPIRType *local_e0;
  SPIRType *res_type;
  SPIRExpression *e;
  _Node_iterator_base<unsigned_int,_false> local_c8;
  bool local_ba;
  allocator local_b9;
  undefined1 local_b8 [6];
  bool forward;
  undefined1 local_98 [8];
  string load_expr;
  string local_68;
  bool local_41;
  SPIRType *pSStack_40;
  bool composite_load;
  SPIRType *type;
  SPIRAccessChain *chain;
  uint32_t local_28;
  uint32_t ptr;
  uint32_t id;
  uint32_t result_type;
  uint32_t *ops;
  Instruction *instruction_local;
  CompilerHLSL *this_local;
  
  ops = (uint32_t *)instruction;
  instruction_local = (Instruction *)this;
  _id = Compiler::stream((Compiler *)this,instruction);
  ptr = *_id;
  local_28 = _id[1];
  chain._4_4_ = _id[2];
  type = (SPIRType *)Compiler::maybe_get<spirv_cross::SPIRAccessChain>((Compiler *)this,chain._4_4_)
  ;
  if (type != (SPIRType *)0x0) {
    pSStack_40 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,ptr);
    bVar1 = VectorView<unsigned_int>::empty(&(pSStack_40->array).super_VectorView<unsigned_int>);
    local_171 = true;
    if (bVar1) {
      local_171 = pSStack_40->basetype == Struct;
    }
    local_41 = local_171;
    if (local_171 != false) {
      CompilerGLSL::emit_uninitialized_temporary_expression(&this->super_CompilerGLSL,ptr,local_28);
      CompilerGLSL::to_expression_abi_cxx11_(&local_68,&this->super_CompilerGLSL,local_28,true);
      read_access_chain(this,(string *)0x0,&local_68,(SPIRAccessChain *)type);
      ::std::__cxx11::string::~string((string *)&local_68);
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      CompilerGLSL::track_expression_read(&this->super_CompilerGLSL,uVar3);
      return;
    }
    ::std::__cxx11::string::string((string *)local_98);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)local_b8,"",&local_b9);
    read_access_chain(this,(string *)local_98,(string *)local_b8,(SPIRAccessChain *)type);
    ::std::__cxx11::string::~string((string *)local_b8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    bVar1 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,chain._4_4_);
    local_18a = false;
    if (bVar1) {
      local_c8._M_cur =
           (__node_type *)
           ::std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::find(&(this->super_CompilerGLSL).super_Compiler.forced_temporaries,&local_28);
      e = (SPIRExpression *)
          ::std::
          end<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>>
                    (&(this->super_CompilerGLSL).super_Compiler.forced_temporaries);
      local_18a = ::std::__detail::operator==
                            (&local_c8,(_Node_iterator_base<unsigned_int,_false> *)&e);
    }
    local_ba = local_18a;
    if (local_18a == false) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      CompilerGLSL::track_expression_read(&this->super_CompilerGLSL,uVar3);
    }
    if (1 < pSStack_40->columns) {
      local_ba = false;
    }
    res_type = (SPIRType *)
               CompilerGLSL::emit_op
                         (&this->super_CompilerGLSL,ptr,local_28,(string *)local_98,
                          (bool)(local_ba & 1),true);
    *(undefined1 *)((long)&res_type->array + 0x19) = 0;
    Compiler::register_read((Compiler *)this,local_28,chain._4_4_,(bool)(local_ba & 1));
    Compiler::inherit_expression_dependencies((Compiler *)this,local_28,chain._4_4_);
    pSVar5 = res_type;
    if ((local_ba & 1U) != 0) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      Compiler::add_implied_read_expression((Compiler *)this,(SPIRExpression *)pSVar5,uVar3);
    }
    ::std::__cxx11::string::~string((string *)local_98);
    return;
  }
  local_e0 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,ptr);
  EVar4 = Compiler::get_execution_model((Compiler *)this);
  bVar1 = false;
  if (EVar4 == ExecutionModelMeshEXT) {
    TypedID<(spirv_cross::Types)0>::TypedID(&local_e4,chain._4_4_);
    bVar2 = Compiler::has_decoration((Compiler *)this,local_e4,BuiltIn);
    bVar1 = false;
    if (bVar2) {
      TypedID<(spirv_cross::Types)0>::TypedID(&local_e8,chain._4_4_);
      uVar3 = Compiler::get_decoration((Compiler *)this,local_e8,BuiltIn);
      if (uVar3 != 3) {
        TypedID<(spirv_cross::Types)0>::TypedID
                  ((TypedID<(spirv_cross::Types)0> *)((long)&load_expr_1.field_2 + 0xc),chain._4_4_)
        ;
        uVar3 = Compiler::get_decoration((Compiler *)this,(ID)load_expr_1.field_2._12_4_,BuiltIn);
        bVar1 = false;
        if (uVar3 != 4) goto LAB_002da5bd;
      }
      bVar2 = Compiler::is_array((Compiler *)this,local_e0);
      bVar1 = false;
      if (bVar2) {
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_e0->parent_type);
        pSVar5 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
        bVar2 = Compiler::is_array((Compiler *)this,pSVar5);
        bVar1 = false;
        if (!bVar2) {
          uVar3 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,local_e0);
          bVar1 = 1 < uVar3;
        }
      }
    }
  }
LAB_002da5bd:
  if (bVar1) {
    CompilerGLSL::track_expression_read(&this->super_CompilerGLSL,chain._4_4_);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&num_elements,"{ ",(allocator *)((long)&i + 3));
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
    local_118 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,local_e0);
    for (local_11c = 0; local_11c < local_118; local_11c = local_11c + 1) {
      CompilerGLSL::to_expression_abi_cxx11_(&local_160,&this->super_CompilerGLSL,chain._4_4_,true);
      local_168 = CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,local_11c);
      join<std::__cxx11::string,char_const(&)[2],char_const*>
                (&local_140,(spirv_cross *)&local_160,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x565143,
                 (char (*) [2])&local_168,in_R8);
      ::std::__cxx11::string::operator+=((string *)&num_elements,(string *)&local_140);
      ::std::__cxx11::string::~string((string *)&local_140);
      ::std::__cxx11::string::~string((string *)&local_160);
      if (local_11c + 1 < local_118) {
        ::std::__cxx11::string::operator+=((string *)&num_elements,", ");
      }
    }
    ::std::__cxx11::string::operator+=((string *)&num_elements," }");
    CompilerGLSL::emit_op
              (&this->super_CompilerGLSL,ptr,local_28,(string *)&num_elements,false,false);
    Compiler::register_read((Compiler *)this,local_28,chain._4_4_,false);
    Compiler::inherit_expression_dependencies((Compiler *)this,local_28,chain._4_4_);
    ::std::__cxx11::string::~string((string *)&num_elements);
  }
  else {
    CompilerGLSL::emit_instruction(&this->super_CompilerGLSL,(Instruction *)ops);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_load(const Instruction &instruction)
{
	auto ops = stream(instruction);

	uint32_t result_type = ops[0];
	uint32_t id = ops[1];
	uint32_t ptr = ops[2];

	auto *chain = maybe_get<SPIRAccessChain>(ptr);
	if (chain)
	{
		auto &type = get<SPIRType>(result_type);
		bool composite_load = !type.array.empty() || type.basetype == SPIRType::Struct;

		if (composite_load)
		{
			// We cannot make this work in one single expression as we might have nested structures and arrays,
			// so unroll the load to an uninitialized temporary.
			emit_uninitialized_temporary_expression(result_type, id);
			read_access_chain(nullptr, to_expression(id), *chain);
			track_expression_read(chain->self);
		}
		else
		{
			string load_expr;
			read_access_chain(&load_expr, "", *chain);

			bool forward = should_forward(ptr) && forced_temporaries.find(id) == end(forced_temporaries);

			// If we are forwarding this load,
			// don't register the read to access chain here, defer that to when we actually use the expression,
			// using the add_implied_read_expression mechanism.
			if (!forward)
				track_expression_read(chain->self);

			// Do not forward complex load sequences like matrices, structs and arrays.
			if (type.columns > 1)
				forward = false;

			auto &e = emit_op(result_type, id, load_expr, forward, true);
			e.need_transpose = false;
			register_read(id, ptr, forward);
			inherit_expression_dependencies(id, ptr);
			if (forward)
				add_implied_read_expression(e, chain->self);
		}
	}
	else
	{
		// Very special case where we cannot rely on IO lowering.
		// Mesh shader clip/cull arrays ... Cursed.
		auto &res_type = get<SPIRType>(result_type);
		if (get_execution_model() == ExecutionModelMeshEXT &&
		    has_decoration(ptr, DecorationBuiltIn) &&
		    (get_decoration(ptr, DecorationBuiltIn) == BuiltInClipDistance ||
		     get_decoration(ptr, DecorationBuiltIn) == BuiltInCullDistance) &&
		    is_array(res_type) && !is_array(get<SPIRType>(res_type.parent_type)) &&
		    to_array_size_literal(res_type) > 1)
		{
			track_expression_read(ptr);
			string load_expr = "{ ";
			uint32_t num_elements = to_array_size_literal(res_type);
			for (uint32_t i = 0; i < num_elements; i++)
			{
				load_expr += join(to_expression(ptr), ".", index_to_swizzle(i));
				if (i + 1 < num_elements)
					load_expr += ", ";
			}
			load_expr += " }";
			emit_op(result_type, id, load_expr, false);
			register_read(id, ptr, false);
			inherit_expression_dependencies(id, ptr);
		}
		else
		{
			CompilerGLSL::emit_instruction(instruction);
		}
	}
}